

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

void __thiscall icu_63::RegexMatcher::RegexMatcher(RegexMatcher *this,RegexPattern *pat)

{
  UBool UVar1;
  RegexPattern *pat_local;
  RegexMatcher *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__RegexMatcher_005b5978;
  this->fDeferredStatus = U_ZERO_ERROR;
  init(this,(EVP_PKEY_CTX *)&this->fDeferredStatus);
  UVar1 = ::U_FAILURE(this->fDeferredStatus);
  if (UVar1 == '\0') {
    if (pat == (RegexPattern *)0x0) {
      this->fDeferredStatus = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      this->fPattern = pat;
      init2(this,*(UText **)(RegexStaticSets::gStaticSets + 0x5d8),&this->fDeferredStatus);
    }
  }
  return;
}

Assistant:

RegexMatcher::RegexMatcher(const RegexPattern *pat)  {
    fDeferredStatus = U_ZERO_ERROR;
    init(fDeferredStatus);
    if (U_FAILURE(fDeferredStatus)) {
        return;
    }
    if (pat==NULL) {
        fDeferredStatus = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    fPattern = pat;
    init2(RegexStaticSets::gStaticSets->fEmptyText, fDeferredStatus);
}